

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitT(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  PtexSeparableKernel *in_RDI;
  int w;
  uint in_stack_ffffffffffffffcc;
  Res in_stack_ffffffffffffffd6;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe8;
  
  iVar1 = in_RDI->v + in_RDI->vw;
  iVar2 = Res::v(&in_RDI->res);
  iVar2 = iVar1 - iVar2;
  if (iVar2 < in_RDI->vw) {
    set((PtexSeparableKernel *)((ulong)in_stack_ffffffffffffffcc << 0x20),in_stack_ffffffffffffffd6,
        (int)((ulong)(in_RDI->kv + ((long)in_RDI->vw - (long)iVar2)) >> 0x20),
        (int)(in_RDI->kv + ((long)in_RDI->vw - (long)iVar2)),(int)((ulong)in_RDI->ku >> 0x20),
        (int)in_RDI->ku,(float *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
        (float *)CONCAT44(iVar2,CONCAT22(in_RDI->res,in_stack_ffffffffffffffe8)),(int)in_RSI);
    in_RDI->vw = in_RDI->vw - iVar2;
  }
  else {
    operator=((PtexSeparableKernel *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_RDI);
    iVar1 = Res::v(&in_RDI->res);
    *(int *)(in_RSI + 8) = *(int *)(in_RSI + 8) - iVar1;
    in_RDI->v = 0;
    in_RDI->vw = 0;
  }
  return;
}

Assistant:

void splitT(PtexSeparableKernel& k)
    {
        // split off top piece of width w into k
        int w = v + vw - res.v();
        if (w < vw) {
            // normal case - split off a portion
            //    res  u  v  uw vw  ku  kv
            k.set(res, u, 0, uw, w, ku, kv + vw - w);

            // update local
            vw -= w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.v -= res.v();
            v = 0; vw = 0;
        }
    }